

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  undefined8 uVar1;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 local_a0 [72];
  cmListFileBacktrace local_58;
  
  cmMakefile::GetBacktrace(&local_58,mf);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_a0 + 8),&local_58);
  std::__cxx11::string::_M_assign((string *)this);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a0,(string *)(local_a0 + 8));
  uVar1 = local_a0._0_8_;
  local_a0._0_8_ = (pointer)0x0;
  this->NameExpression = (cmCompiledGeneratorExpression *)uVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_a0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_a0 + 8));
  cmListFileBacktrace::~cmListFileBacktrace(&local_58);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name).release();
}